

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O0

ostream * cnn::operator<<(ostream *os,Dim *d)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  uint i;
  undefined4 local_14;
  
  std::operator<<(in_RDI,'{');
  for (local_14 = 0; local_14 < *(uint *)(in_RSI + 0x1c); local_14 = local_14 + 1) {
    if (local_14 != 0) {
      std::operator<<(in_RDI,',');
    }
    std::ostream::operator<<(in_RDI,*(uint *)(in_RSI + (ulong)local_14 * 4));
  }
  if (*(int *)(in_RSI + 0x20) != 1) {
    poVar1 = std::operator<<(in_RDI,'X');
    std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x20));
  }
  poVar1 = std::operator<<(in_RDI,'}');
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& os, const Dim& d) {
  os << '{';
  for (unsigned i = 0; i < d.nd; ++i) {
    if (i) os << ',';
    os << d.d[i];
  }
  if(d.bd != 1) os << 'X' << d.bd;
  return os << '}';
}